

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

int Saig_SynchSavePattern
              (Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,int iPat,Vec_Str_t *vSequence)

{
  int iVar1;
  uint v;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int local_58;
  int local_54;
  int w;
  int i;
  int Value;
  int Counter;
  uint *pSim;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Str_t *vSequence_local;
  int iPat_local;
  int nWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  if (iPat < nWords * 0x10) {
    local_54 = 0;
    while( true ) {
      iVar1 = Saig_ManPiNum(pAig);
      if (local_54 < iVar1) {
        pObjLi = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_54);
      }
      if (local_54 >= iVar1) break;
      pvVar5 = Vec_PtrEntry(vSimInfo,pObjLi->Id);
      Vec_StrPush(vSequence,
                  (byte)(*(uint *)((long)pvVar5 + (long)(iPat >> 4) * 4) >>
                        (sbyte)((iPat & 0xfU) << 1)) & 3);
      local_54 = local_54 + 1;
    }
    i = 0;
    for (local_54 = 0; iVar1 = Saig_ManRegNum(pAig), local_54 < iVar1; local_54 = local_54 + 1) {
      pAVar3 = Saig_ManLi(pAig,local_54);
      pAVar4 = Saig_ManLo(pAig,local_54);
      pvVar5 = Vec_PtrEntry(vSimInfo,pAVar3->Id);
      v = *(uint *)((long)pvVar5 + (long)(iPat >> 4) * 4) >> (sbyte)((iPat & 0xfU) << 1) & 3;
      i = (uint)(v == 3) + i;
      pvVar5 = Vec_PtrEntry(vSimInfo,pAVar4->Id);
      for (local_58 = 0; local_58 < nWords; local_58 = local_58 + 1) {
        uVar2 = Saig_SynchTernary(v);
        *(uint *)((long)pvVar5 + (long)local_58 * 4) = uVar2;
      }
    }
    return i;
  }
  __assert_fail("iPat < 16 * nWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                ,0x147,"int Saig_SynchSavePattern(Aig_Man_t *, Vec_Ptr_t *, int, int, Vec_Str_t *)")
  ;
}

Assistant:

int Saig_SynchSavePattern( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, int iPat, Vec_Str_t * vSequence )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    unsigned * pSim;
    int Counter, Value, i, w;
    assert( iPat < 16 * nWords );
    Saig_ManForEachPi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        Value = (pSim[iPat>>4] >> ((iPat&0xf) << 1)) & 3;
        Vec_StrPush( vSequence, (char)Value );
//        printf( "%d ", Value );
    }
//    printf( "\n" );
    Counter = 0;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLi->Id );
        Value = (pSim[iPat>>4] >> ((iPat&0xf) << 1)) & 3;
        Counter += (Value == 3);
        // save patern in the same register
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLo->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( Value );
    }
    return Counter;
}